

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeline.cpp
# Opt level: O1

bool __thiscall
duckdb::Pipeline::ScheduleParallel(Pipeline *this,shared_ptr<duckdb::Event,_true> *event)

{
  optional_ptr<duckdb::PhysicalOperator,_true> *this_00;
  optional_ptr<duckdb::PhysicalOperator,_true> *this_01;
  pointer prVar1;
  char cVar2;
  int iVar3;
  pointer pGVar4;
  undefined4 extraout_var;
  DatabaseInstance *this_02;
  TaskScheduler *pTVar5;
  unsigned_long max_threads;
  pointer pGVar6;
  ulong uVar7;
  InternalException *this_03;
  pointer prVar8;
  bool bVar9;
  OperatorPartitionInfo partition_info;
  string local_70;
  char local_50 [8];
  void *local_48;
  undefined4 extraout_var_00;
  
  this_00 = &this->sink;
  optional_ptr<duckdb::PhysicalOperator,_true>::CheckValid(this_00);
  iVar3 = (*((this->sink).ptr)->_vptr_PhysicalOperator[0x22])();
  if ((char)iVar3 != '\0') {
    this_01 = &this->source;
    optional_ptr<duckdb::PhysicalOperator,_true>::CheckValid(this_01);
    iVar3 = (*((this->source).ptr)->_vptr_PhysicalOperator[0x14])();
    if ((char)iVar3 != '\0') {
      prVar8 = (this->operators).
               super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
               .
               super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      prVar1 = (this->operators).
               super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
               .
               super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      bVar9 = prVar8 == prVar1;
      if (!bVar9) {
        iVar3 = (*prVar8->_M_data->_vptr_PhysicalOperator[0xc])();
        cVar2 = (char)iVar3;
        while (cVar2 != '\0') {
          prVar8 = prVar8 + 1;
          bVar9 = prVar8 == prVar1;
          if (bVar9) goto LAB_016f25f0;
          iVar3 = (*prVar8->_M_data->_vptr_PhysicalOperator[0xc])();
          cVar2 = (char)iVar3;
        }
        if (!bVar9) {
          return false;
        }
      }
LAB_016f25f0:
      optional_ptr<duckdb::PhysicalOperator,_true>::CheckValid(this_00);
      (*this_00->ptr->_vptr_PhysicalOperator[0x23])(local_50);
      if (local_50[0] == '\x01') {
        optional_ptr<duckdb::PhysicalOperator,_true>::CheckValid(this_01);
        local_70._M_dataplus._M_p._0_1_ = 1;
        local_70._M_string_length = 0;
        local_70.field_2._M_allocated_capacity = 0;
        local_70.field_2._8_8_ = 0;
        iVar3 = (*this_01->ptr->_vptr_PhysicalOperator[0x15])();
        if ((void *)local_70._M_string_length != (void *)0x0) {
          operator_delete((void *)local_70._M_string_length);
        }
        if ((char)iVar3 == '\0') {
          this_03 = (InternalException *)__cxa_allocate_exception(0x10);
          local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_70,
                     "Attempting to schedule a pipeline where the sink requires batch index but source does not support it"
                     ,"");
          InternalException::InternalException(this_03,&local_70);
          __cxa_throw(this_03,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
        }
      }
      pGVar4 = unique_ptr<duckdb::GlobalSourceState,_std::default_delete<duckdb::GlobalSourceState>,_true>
               ::operator->(&this->source_state);
      iVar3 = (*pGVar4->_vptr_GlobalSourceState[2])(pGVar4);
      this_02 = DatabaseInstance::GetDatabase(this->executor->context);
      pTVar5 = DatabaseInstance::GetScheduler(this_02);
      max_threads = NumericCastImpl<unsigned_long,_int,_false>::Convert
                              ((pTVar5->current_thread_count).super___atomic_base<int>._M_i);
      uVar7 = CONCAT44(extraout_var,iVar3);
      if (max_threads <= CONCAT44(extraout_var,iVar3)) {
        uVar7 = max_threads;
      }
      if ((this_00->ptr != (PhysicalOperator *)0x0) &&
         (optional_ptr<duckdb::PhysicalOperator,_true>::CheckValid(this_00),
         (this_00->ptr->sink_state).
         super_unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::GlobalSinkState_*,_std::default_delete<duckdb::GlobalSinkState>_>
         .super__Head_base<0UL,_duckdb::GlobalSinkState_*,_false>._M_head_impl !=
         (GlobalSinkState *)0x0)) {
        optional_ptr<duckdb::PhysicalOperator,_true>::CheckValid(this_00);
        pGVar6 = unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>
                 ::operator->(&this_00->ptr->sink_state);
        iVar3 = (*pGVar6->_vptr_GlobalSinkState[2])(pGVar6,uVar7);
        uVar7 = CONCAT44(extraout_var_00,iVar3);
      }
      if (uVar7 < max_threads) {
        max_threads = uVar7;
      }
      bVar9 = LaunchScanTasks(this,event,max_threads);
      if (local_48 != (void *)0x0) {
        operator_delete(local_48);
        return bVar9;
      }
      return bVar9;
    }
  }
  return false;
}

Assistant:

bool Pipeline::ScheduleParallel(shared_ptr<Event> &event) {
	// check if the sink, source and all intermediate operators support parallelism
	if (!sink->ParallelSink()) {
		return false;
	}
	if (!source->ParallelSource()) {
		return false;
	}
	for (auto &op_ref : operators) {
		auto &op = op_ref.get();
		if (!op.ParallelOperator()) {
			return false;
		}
	}
	auto partition_info = sink->RequiredPartitionInfo();
	if (partition_info.batch_index) {
		if (!source->SupportsPartitioning(OperatorPartitionInfo::BatchIndex())) {
			throw InternalException(
			    "Attempting to schedule a pipeline where the sink requires batch index but source does not support it");
		}
	}
	auto max_threads = source_state->MaxThreads();
	auto &scheduler = TaskScheduler::GetScheduler(executor.context);
	auto active_threads = NumericCast<idx_t>(scheduler.NumberOfThreads());
	if (max_threads > active_threads) {
		max_threads = active_threads;
	}
	if (sink && sink->sink_state) {
		max_threads = sink->sink_state->MaxThreads(max_threads);
	}
	if (max_threads > active_threads) {
		max_threads = active_threads;
	}
	return LaunchScanTasks(event, max_threads);
}